

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_filter.hpp
# Opt level: O0

void MeanField::Filtering::applyGaussianKernelY
               (float *input,float *output,float *kernel,float sd,int dim,int x,int y,int W,int H)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  int local_54;
  int local_50;
  int i_2;
  int i_1;
  int idx;
  int r;
  float normaliser;
  int rad;
  int i;
  float *channelSums;
  int y_local;
  int x_local;
  int dim_local;
  float sd_local;
  float *kernel_local;
  float *output_local;
  float *input_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)dim;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  for (normaliser = 0.0; (int)normaliser < dim; normaliser = (float)((int)normaliser + 1)) {
    *(undefined4 *)((long)pvVar5 + (long)(int)normaliser * 4) = 0;
  }
  iVar2 = (int)sd;
  idx = 0;
  for (i_1 = -iVar2; i_1 <= iVar2; i_1 = i_1 + 1) {
    iVar3 = y + i_1;
    if ((-1 < iVar3) && (iVar3 < H)) {
      idx = (int)(kernel[iVar2 - i_1] + (float)idx);
      for (local_50 = 0; local_50 < dim; local_50 = local_50 + 1) {
        *(float *)((long)pvVar5 + (long)local_50 * 4) =
             input[(iVar3 * W + x) * dim + local_50] * kernel[iVar2 - i_1] +
             *(float *)((long)pvVar5 + (long)local_50 * 4);
      }
    }
  }
  if (0.0 < (float)idx) {
    for (local_54 = 0; local_54 < dim; local_54 = local_54 + 1) {
      output[(y * W + x) * dim + local_54] =
           *(float *)((long)pvVar5 + (long)local_54 * 4) / (float)idx;
    }
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyGaussianKernelY(const float *input, float *output, const float *kernel, float sd,
                int dim, int x, int y, int W, int H) {
            float *channelSums = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSums[i] = 0.0;
            }

            int rad = static_cast<int>(sd);
            float normaliser = 0.0;
            for (int r = -rad; r <= rad; r++) {
                int idx = y + r;
                if (idx < 0 || idx >= H) {
                    continue;
                }

                normaliser += kernel[rad - r];
                for (int i = 0; i < dim; i++) {
                    channelSums[i] += input[(idx*W + x)*dim + i] * kernel[rad - r];
                }
            }

            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSums[i] / normaliser;
                }
            }
            delete[] channelSums;
        }